

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmAndisr<(moira::Instr)12,(moira::Mode)11,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Imu im;
  StrWriter *this_00;
  
  im.raw = dasmRead<(moira::Size)2>(this,addr);
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Align)(this->tab).raw);
  StrWriter::operator<<(this_00,im);
  StrWriter::operator<<(this_00,", SR");
  return;
}

Assistant:

void
Moira::dasmAndisr(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imu ( dasmRead<S>(addr) );

    str << Ins<I>{} << tab << src << ", SR";
}